

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleLightObject
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  aiLightSourceType aVar1;
  bool bVar2;
  aiLight *paVar3;
  string *psVar4;
  Property *pPVar5;
  char *__s;
  allocator<char> local_71;
  aiLight *light;
  string typeStr;
  string objName;
  
  paVar3 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(paVar3);
  light = paVar3;
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back(&this->m_lightCache,&light);
  psVar4 = ODDLParser::DDLNode::getName_abi_cxx11_(node);
  std::__cxx11::string::string((string *)&objName,(string *)psVar4);
  paVar3 = light;
  if (0xfffffffffffffc00 < objName._M_string_length - 0x400) {
    (light->mName).length = (ai_uint32)objName._M_string_length;
    memcpy((light->mName).data,objName._M_dataplus._M_p,objName._M_string_length);
    (paVar3->mName).data[objName._M_string_length] = '\0';
  }
  this->m_currentLight = light;
  std::__cxx11::string::string<std::allocator<char>>((string *)&typeStr,"type",&local_71);
  pPVar5 = ODDLParser::DDLNode::findPropertyByName(node,&typeStr);
  std::__cxx11::string::~string((string *)&typeStr);
  if ((pPVar5 == (Property *)0x0) || (pPVar5->m_value == (Value *)0x0)) goto LAB_0044ad45;
  __s = ODDLParser::Value::getString(pPVar5->m_value);
  std::__cxx11::string::string<std::allocator<char>>((string *)&typeStr,__s,&local_71);
  bVar2 = std::operator==("point",&typeStr);
  if (bVar2) {
    aVar1 = aiLightSource_POINT;
LAB_0044ad2d:
    this->m_currentLight->mType = aVar1;
  }
  else {
    bVar2 = std::operator==("spot",&typeStr);
    if (bVar2) {
      aVar1 = aiLightSource_SPOT;
      goto LAB_0044ad2d;
    }
    bVar2 = std::operator==("infinite",&typeStr);
    if (bVar2) {
      aVar1 = aiLightSource_DIRECTIONAL;
      goto LAB_0044ad2d;
    }
  }
  std::__cxx11::string::~string((string *)&typeStr);
LAB_0044ad45:
  handleNodes(this,node,pScene);
  std::__cxx11::string::~string((string *)&objName);
  return;
}

Assistant:

void OpenGEXImporter::handleLightObject( ODDLParser::DDLNode *node, aiScene *pScene ) {
    aiLight *light( new aiLight );
    m_lightCache.push_back( light );
    std::string objName = node->getName();
    if ( !objName.empty() ) {
        light->mName.Set( objName );
    }
    m_currentLight = light;

    Property *prop( node->findPropertyByName( "type" ) );
    if ( nullptr != prop ) {
        if ( nullptr != prop->m_value ) {
            std::string typeStr( prop->m_value->getString() );
            if ( "point" == typeStr ) {
                m_currentLight->mType = aiLightSource_POINT;
            } else if ( "spot" == typeStr ) {
                m_currentLight->mType = aiLightSource_SPOT;
            } else if ( "infinite" == typeStr ) {
                m_currentLight->mType = aiLightSource_DIRECTIONAL;
            }
        }
    }

    // parameters will be parsed normally in the tree, so just go for it
    handleNodes( node, pScene );
}